

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

unsigned_long stb_rand(void)

{
  ulong uVar1;
  int local_2c;
  int i;
  unsigned_long r;
  unsigned_long s;
  int idx;
  unsigned_long *b;
  
  s._4_4_ = stb__mt_index;
  if (0x137f < (uint)stb__mt_index) {
    if (0x1380 < (uint)stb__mt_index) {
      stb_srand(0);
    }
    s._4_4_ = 0;
    for (local_2c = 0; local_2c < 0xe3; local_2c = local_2c + 1) {
      stb__mt_buffer[local_2c] =
           stb__mt_buffer[local_2c + 0x18d] ^
           (stb__mt_buffer[local_2c] & 0x80000000 | stb__mt_buffer[local_2c + 1] & 0x7fffffff) >> 1
           ^ (stb__mt_buffer[local_2c + 1] & 1) * 0x9908b0df;
    }
    for (; local_2c < 0x26f; local_2c = local_2c + 1) {
      stb__mt_buffer[local_2c] =
           stb__mt_buffer[local_2c + -0xe3] ^
           (stb__mt_buffer[local_2c] & 0x80000000 | stb__mt_buffer[local_2c + 1] & 0x7fffffff) >> 1
           ^ (stb__mt_buffer[local_2c + 1] & 1) * 0x9908b0df;
    }
    stb__mt_buffer[0x26f] =
         stb__mt_buffer[0x18c] ^
         (stb__mt_buffer[0x26f] & 0x80000000 | stb__mt_buffer[0] & 0x7fffffff) >> 1 ^
         (stb__mt_buffer[0] & 1) * 0x9908b0df;
  }
  stb__mt_index = s._4_4_ + 8;
  uVar1 = *(ulong *)((long)stb__mt_buffer + (long)s._4_4_) >> 0xb ^
          *(ulong *)((long)stb__mt_buffer + (long)s._4_4_);
  uVar1 = (uVar1 & 0x13a58ad) << 7 ^ uVar1;
  uVar1 = (uVar1 & 0x1df8c) << 0xf ^ uVar1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

unsigned long stb_rand()
{
   unsigned long * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned long s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned long)) {
      if (idx > STB__MT_LEN*sizeof(unsigned long))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned long);
   
   r = *(unsigned long *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}